

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.h
# Opt level: O2

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,uint num_tokens)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  jsmntok_t *pjVar15;
  
  uVar8 = parser->pos;
  uVar12 = parser->toknext;
  iVar10 = -2;
  uVar13 = uVar12;
  uVar11 = uVar12;
  uVar3 = uVar12;
LAB_001068e5:
  uVar6 = (ulong)uVar12;
  if (len <= uVar8) {
LAB_00106ccb:
    uVar13 = uVar3;
    if (tokens != (jsmntok_t *)0x0) {
      do {
        uVar6 = uVar6 - 1;
        if ((int)(uint)uVar6 < 0) {
          return uVar3;
        }
        uVar8 = (uint)uVar6 & 0x7fffffff;
      } while ((tokens[uVar8].start == -1) || (uVar13 = 0xfffffffd, tokens[uVar8].end != -1));
    }
    return uVar13;
  }
  bVar1 = js[uVar8];
  if (((1 < bVar1 - 9) && (bVar1 != 0xd)) && (bVar1 != 0x20)) {
    if (bVar1 == 0x22) {
      uVar7 = uVar8 + 1;
      do {
        parser->pos = uVar7;
        if (len <= uVar7) {
LAB_00106cc0:
          iVar10 = -3;
          goto LAB_00106cc6;
        }
        cVar2 = js[uVar7];
        if (cVar2 == '\\') {
          uVar14 = uVar7 + 1;
          if (uVar14 < len) {
            parser->pos = uVar14;
            uVar9 = (byte)js[uVar14] - 0x62;
            uVar7 = uVar14;
            if (((0x12 < uVar9) || ((0x51011U >> (uVar9 & 0x1f) & 1) == 0)) &&
               ((uVar14 = (byte)js[uVar14] - 0x22, 0x3a < uVar14 ||
                ((0x400000000002001U >> ((ulong)uVar14 & 0x3f) & 1) == 0)))) goto LAB_00106cc6;
          }
        }
        else {
          if (cVar2 == '\0') goto LAB_00106cc0;
          if (cVar2 == '\"') goto LAB_00106c06;
        }
        uVar7 = uVar7 + 1;
      } while( true );
    }
    if (bVar1 == 0x2c) {
      if (((tokens != (jsmntok_t *)0x0) && ((long)parser->toksuper != -1)) &&
         (uVar7 = uVar11, 1 < tokens[parser->toksuper].type - JSMN_OBJECT)) {
        do {
          uVar14 = uVar7;
          uVar7 = uVar14 - 1;
          if ((int)uVar7 < 0) goto LAB_00106b33;
          uVar9 = uVar7 & 0x7fffffff;
        } while (((1 < tokens[uVar9].type - JSMN_OBJECT) || (tokens[uVar9].start == -1)) ||
                (tokens[uVar9].end != -1));
        parser->toksuper = uVar14 - 1;
      }
    }
    else if (bVar1 == 0x3a) {
      parser->toksuper = uVar13 - 1;
      uVar11 = uVar13;
    }
    else {
      if (bVar1 != 0x5b) {
        if (bVar1 != 0x5d) {
          if (bVar1 == 0x7b) goto LAB_00106a08;
          if (bVar1 != 0x7d) {
            uVar7 = uVar8;
            if (bVar1 != 0) {
              while (uVar7 < len) {
                bVar1 = js[uVar7];
                if ((((ulong)bVar1 < 0x3b) &&
                    ((0x400100100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
                   ((bVar1 == 0x5d || (bVar1 == 0x7d)))) break;
                if ((byte)(bVar1 + 0x81) < 0xa1) goto LAB_00106cc6;
                uVar7 = uVar7 + 1;
                parser->pos = uVar7;
              }
              if (tokens != (jsmntok_t *)0x0) {
                if (num_tokens <= uVar12) goto LAB_00106d17;
                uVar13 = uVar12 + 1;
                parser->toknext = uVar13;
                tokens[uVar6].type = JSMN_PRIMITIVE;
                tokens[uVar6].start = uVar8;
                tokens[uVar6].end = uVar7;
                tokens[uVar6].size = 0;
                uVar11 = uVar13;
                uVar12 = uVar13;
              }
              uVar8 = uVar7 - 1;
              uVar3 = uVar3 + 1;
              if ((long)parser->toksuper != -1 && tokens != (jsmntok_t *)0x0) {
                tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
              }
              goto LAB_00106b33;
            }
            goto LAB_00106ccb;
          }
        }
        if (tokens != (jsmntok_t *)0x0) {
          do {
            uVar5 = uVar6;
            uVar6 = uVar5 - 1;
            if ((int)(uint)uVar6 < 0) goto LAB_00106b98;
            uVar13 = (uint)uVar6 & 0x7fffffff;
          } while ((tokens[uVar13].start == -1) || (pjVar15 = tokens + uVar13, pjVar15->end != -1));
          if (pjVar15->type != (bVar1 != 0x7d) + JSMN_OBJECT) {
            return -2;
          }
          parser->toksuper = -1;
          pjVar15->end = uVar8 + 1;
LAB_00106b98:
          uVar6 = uVar5 - 1;
          if (uVar5 == 0) {
            return -2;
          }
          while (iVar4 = (int)uVar6, uVar13 = uVar12, uVar11 = uVar12, -1 < iVar4) {
            if ((tokens[uVar6 & 0xffffffff].start != -1) && (tokens[uVar6 & 0xffffffff].end == -1))
            {
              parser->toksuper = iVar4;
              break;
            }
            uVar6 = (ulong)(iVar4 - 1);
          }
        }
        goto LAB_00106b33;
      }
LAB_00106a08:
      uVar3 = uVar3 + 1;
      if (tokens != (jsmntok_t *)0x0) {
        if (num_tokens <= uVar12) {
          return -1;
        }
        uVar13 = uVar12 + 1;
        parser->toknext = uVar13;
        tokens[uVar6].end = -1;
        tokens[uVar6].size = 0;
        if ((long)parser->toksuper != -1) {
          tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
        }
        tokens[uVar6].type = (bVar1 != 0x7b) + JSMN_OBJECT;
        tokens[uVar6].start = uVar8;
        parser->toksuper = uVar12;
        uVar11 = uVar13;
        uVar12 = uVar13;
      }
    }
  }
LAB_00106b33:
  uVar8 = uVar8 + 1;
  parser->pos = uVar8;
  goto LAB_001068e5;
LAB_00106c06:
  if (tokens != (jsmntok_t *)0x0) {
    if (num_tokens <= uVar13) {
LAB_00106d17:
      iVar10 = -1;
LAB_00106cc6:
      parser->pos = uVar8;
      return iVar10;
    }
    uVar11 = uVar13 + 1;
    parser->toknext = uVar11;
    tokens[uVar13].type = JSMN_STRING;
    tokens[uVar13].start = uVar8 + 1;
    tokens[uVar13].end = uVar7;
    tokens[uVar13].size = 0;
    uVar13 = uVar11;
    uVar12 = uVar11;
  }
  uVar3 = uVar3 + 1;
  uVar8 = uVar7;
  if ((long)parser->toksuper != -1 && tokens != (jsmntok_t *)0x0) {
    tokens[parser->toksuper].size = tokens[parser->toksuper].size + 1;
  }
  goto LAB_00106b33;
}

Assistant:

JSMN_API int jsmn_parse(jsmn_parser *parser, const char *js, const size_t len,
                        jsmntok_t *tokens, const unsigned int num_tokens) {
  int r;
  int i;
  jsmntok_t *token;
  int count = parser->toknext;

  for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
    char c;
    jsmntype_t type;

    c = js[parser->pos];
    switch (c) {
    case '{':
    case '[':
      count++;
      if (tokens == NULL) {
        break;
      }
      token = jsmn_alloc_token(parser, tokens, num_tokens);
      if (token == NULL) {
        return JSMN_ERROR_NOMEM;
      }
      if (parser->toksuper != -1) {
        jsmntok_t *t = &tokens[parser->toksuper];
#ifdef JSMN_STRICT
        /* In strict mode an object or array can't become a key */
        if (t->type == JSMN_OBJECT) {
          return JSMN_ERROR_INVAL;
        }
#endif
        t->size++;
#ifdef JSMN_PARENT_LINKS
        token->parent = parser->toksuper;
#endif
      }
      token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
      token->start = parser->pos;
      parser->toksuper = parser->toknext - 1;
      break;
    case '}':
    case ']':
      if (tokens == NULL) {
        break;
      }
      type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
      if (parser->toknext < 1) {
        return JSMN_ERROR_INVAL;
      }
      token = &tokens[parser->toknext - 1];
      for (;;) {
        if (token->start != -1 && token->end == -1) {
          if (token->type != type) {
            return JSMN_ERROR_INVAL;
          }
          token->end = parser->pos + 1;
          parser->toksuper = token->parent;
          break;
        }
        if (token->parent == -1) {
          if (token->type != type || parser->toksuper == -1) {
            return JSMN_ERROR_INVAL;
          }
          break;
        }
        token = &tokens[token->parent];
      }
#else
      for (i = parser->toknext - 1; i >= 0; i--) {
        token = &tokens[i];
        if (token->start != -1 && token->end == -1) {
          if (token->type != type) {
            return JSMN_ERROR_INVAL;
          }
          parser->toksuper = -1;
          token->end = parser->pos + 1;
          break;
        }
      }
      /* Error if unmatched closing bracket */
      if (i == -1) {
        return JSMN_ERROR_INVAL;
      }
      for (; i >= 0; i--) {
        token = &tokens[i];
        if (token->start != -1 && token->end == -1) {
          parser->toksuper = i;
          break;
        }
      }
#endif
      break;
    case '\"':
      r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
      if (r < 0) {
        return r;
      }
      count++;
      if (parser->toksuper != -1 && tokens != NULL) {
        tokens[parser->toksuper].size++;
      }
      break;
    case '\t':
    case '\r':
    case '\n':
    case ' ':
      break;
    case ':':
      parser->toksuper = parser->toknext - 1;
      break;
    case ',':
      if (tokens != NULL && parser->toksuper != -1 &&
          tokens[parser->toksuper].type != JSMN_ARRAY &&
          tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
        parser->toksuper = tokens[parser->toksuper].parent;
#else
        for (i = parser->toknext - 1; i >= 0; i--) {
          if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
            if (tokens[i].start != -1 && tokens[i].end == -1) {
              parser->toksuper = i;
              break;
            }
          }
        }
#endif
      }
      break;
#ifdef JSMN_STRICT
    /* In strict mode primitives are: numbers and booleans */
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 't':
    case 'f':
    case 'n':
      /* And they must not be keys of the object */
      if (tokens != NULL && parser->toksuper != -1) {
        const jsmntok_t *t = &tokens[parser->toksuper];
        if (t->type == JSMN_OBJECT ||
            (t->type == JSMN_STRING && t->size != 0)) {
          return JSMN_ERROR_INVAL;
        }
      }
#else
    /* In non-strict mode every unquoted value is a primitive */
    default:
#endif
      r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
      if (r < 0) {
        return r;
      }
      count++;
      if (parser->toksuper != -1 && tokens != NULL) {
        tokens[parser->toksuper].size++;
      }
      break;

#ifdef JSMN_STRICT
    /* Unexpected char in strict mode */
    default:
      return JSMN_ERROR_INVAL;
#endif
    }
  }

  if (tokens != NULL) {
    for (i = parser->toknext - 1; i >= 0; i--) {
      /* Unmatched opened object or array */
      if (tokens[i].start != -1 && tokens[i].end == -1) {
        return JSMN_ERROR_PART;
      }
    }
  }

  return count;
}